

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O0

void __thiscall r_exec::Sim::~Sim(Sim *this)

{
  Sim *this_local;
  
  (this->super__Object)._vptr__Object = (_func_int **)&PTR__Sim_002eb268;
  core::P<r_exec::Controller>::~P(&this->sol);
  core::P<r_exec::Controller>::~P(&this->root);
  core::P<r_exec::Fact>::~P(&this->super_goal);
  core::_Object::~_Object(&this->super__Object);
  return;
}

Assistant:

class REPLICODE_EXPORT Sim:
    public _Object
{
private:
    uint64_t volatile invalidated; // 32 bits alignment.
public:
    Sim();
    Sim(Sim *s); // is_requirement=false (not copied).
    Sim(SimMode mode, uint64_t thz, Fact *super_goal, bool opposite, Controller *root); // use for SIM_ROOT.
    Sim(SimMode mode, uint64_t thz, Fact *super_goal, bool opposite, Controller *root, Controller *sol, double sol_cfd, uint64_t sol_deadline); // USE for SIM_MANDATORY or SIM_OPTIONAL.

    void invalidate();
    bool is_invalidated();

    bool is_requirement;

    bool opposite; // of the goal the sim is attached to, i.e. the result of the match during controller->reduce(); the confidence is in the goal target.

    SimMode mode; // if SIM_MANDATORY or SIM_OPTIONAL: qualifies a sub-goal of the branch's root.
    uint64_t thz; // simulation time allowance (this is not the goal deadline); 0 indicates no time for simulation.
    P<Fact> super_goal; // of the goal the sim is attached to.
    P<Controller> root; // controller that produced the simulation branch root (SIM_ROOT): identifies the branch.
    P<Controller> sol; // controller that produced a sub-goal of the branch's root: identifies the model that can be a solution for the super-goal.
    double sol_cfd; // confidence of the solution goal.
    uint64_t sol_before; // deadline of the solution goal.
}